

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::multiply_zero_padded(bool add_to,tensor *dest,tensor *src1,tensor *src2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  undefined4 extraout_var;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long local_70;
  long local_68;
  float *pfVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar12 = (*dest->_vptr_tensor[3])(dest);
  pfVar13 = (float *)CONCAT44(extraout_var,iVar12);
  iVar12 = (*src1->_vptr_tensor[2])(src1);
  lVar14 = CONCAT44(extraout_var_00,iVar12);
  iVar12 = (*src2->_vptr_tensor[2])(src2);
  lVar15 = CONCAT44(extraout_var_01,iVar12);
  lVar1 = dest->m_n;
  lVar16 = src1->m_n;
  if (((((lVar1 == lVar16) && (dest->m_k == src1->m_k)) && (dest->m_nr == src1->m_nr)) &&
      ((dest->m_nc == src1->m_nc && (lVar1 == src2->m_n)))) &&
     ((dest->m_k == src2->m_k && ((dest->m_nr == src2->m_nr && (dest->m_nc == src2->m_nc)))))) {
    lVar1 = dest->m_size;
    if (add_to) {
      if (lVar1 != 0) {
        lVar16 = 0;
        do {
          auVar20 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar15 + lVar16 * 4)),
                                    ZEXT416(*(uint *)(lVar14 + lVar16 * 4)),
                                    ZEXT416((uint)pfVar13[lVar16]));
          pfVar13[lVar16] = auVar20._0_4_;
          lVar16 = lVar16 + 1;
        } while (lVar1 != lVar16);
      }
    }
    else if (lVar1 != 0) {
      lVar16 = 0;
      do {
        pfVar13[lVar16] = *(float *)(lVar14 + lVar16 * 4) * *(float *)(lVar15 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar1 != lVar16);
    }
  }
  else if (0 < lVar1) {
    lVar2 = dest->m_k;
    lVar3 = dest->m_nr;
    local_70 = 0;
    do {
      if (0 < lVar2) {
        lVar4 = dest->m_nc;
        local_68 = 0;
        do {
          if (0 < lVar3) {
            lVar5 = src2->m_n;
            lVar18 = 0;
            do {
              if (0 < lVar4) {
                lVar6 = src1->m_k;
                lVar7 = src1->m_nr;
                lVar8 = src2->m_k;
                lVar9 = src2->m_nr;
                lVar10 = src1->m_nc;
                lVar11 = src2->m_nc;
                lVar17 = 0;
                do {
                  auVar20 = ZEXT816(0) << 0x40;
                  auVar21 = ZEXT816(0) << 0x40;
                  if (lVar17 < lVar10 && ((local_68 < lVar6 && local_70 < lVar16) && lVar18 < lVar7)
                     ) {
                    auVar21 = ZEXT416(*(uint *)(lVar14 + ((lVar6 * local_70 + local_68) * lVar7 +
                                                         lVar18) * lVar10 * 4 + lVar17 * 4));
                  }
                  if (lVar17 < lVar11 && ((local_68 < lVar8 && local_70 < lVar5) && lVar18 < lVar9))
                  {
                    auVar20 = ZEXT416(*(uint *)(lVar15 + ((lVar8 * local_70 + local_68) * lVar9 +
                                                         lVar18) * lVar11 * 4 + lVar17 * 4));
                  }
                  if (add_to) {
                    auVar20 = vfmadd213ss_fma(auVar20,auVar21,ZEXT416((uint)*pfVar13));
                    fVar19 = auVar20._0_4_;
                  }
                  else {
                    fVar19 = auVar21._0_4_ * auVar20._0_4_;
                  }
                  *pfVar13 = fVar19;
                  pfVar13 = pfVar13 + 1;
                  lVar17 = lVar17 + 1;
                } while (lVar4 != lVar17);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != lVar3);
          }
          local_68 = local_68 + 1;
        } while (local_68 != lVar2);
      }
      local_70 = local_70 + 1;
    } while (local_70 != lVar1);
  }
  return;
}

Assistant:

void multiply_zero_padded (
            bool add_to,
            tensor& dest,
            const tensor& src1,
            const tensor& src2
        )
        {
            auto d = dest.host();
            auto s1 = src1.host();
            auto s2 = src2.host();

            // Do the simple and fast version if everything has the same dimensions
            if (have_same_dimensions(dest, src1) &&
                have_same_dimensions(dest, src2))
            {
                if (add_to)
                {
                    for (size_t i = 0; i < dest.size(); ++i)
                        d[i] += s1[i] * s2[i];
                }
                else
                {
                    for (size_t i = 0; i < dest.size(); ++i)
                        d[i] = s1[i] * s2[i];
                }
                return;
            }

            // Otherwise, do the more complex version with bounds checking.
            for (long n = 0; n < dest.num_samples(); ++n)
            {
                for (long k = 0; k < dest.k(); ++k)
                {
                    for (long r = 0; r < dest.nr(); ++r)
                    {
                        for (long c = 0; c < dest.nc(); ++c)
                        {
                            float v1 = 0;
                            float v2 = 0;

                            // if this index is inside src1
                            if (n < src1.num_samples() && 
                                k < src1.k() && 
                                r < src1.nr() && 
                                c < src1.nc() )
                            {
                                const auto s_idx = ((n*src1.k() + k)*src1.nr() + r)*src1.nc() + c;
                                v1 = s1[s_idx];
                            }

                            // if this index is inside src2
                            if (n < src2.num_samples() && 
                                k < src2.k() && 
                                r < src2.nr() && 
                                c < src2.nc() )
                            {
                                const auto s_idx = ((n*src2.k() + k)*src2.nr() + r)*src2.nc() + c;
                                v2 = s2[s_idx];
                            }

                            if (add_to)
                                *d += v1 * v2;
                            else
                                *d = v1 * v2;
                            ++d;
                        }
                    }
                }
            }
        }